

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O1

int Bal_ManSetGateLevel(Bal_Man_t *p,Gia_Obj_t *pObjOld,int iLitNew)

{
  Gia_Man_t *pGVar1;
  uint *puVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Vec_Ptr_t *pVVar10;
  int in_R9D;
  int Target;
  uint iFan0;
  bool bVar11;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffb8;
  
  if (-1 < iLitNew) {
    uVar7 = (uint)iLitNew >> 1;
    pGVar1 = p->pNew;
    if (pGVar1->nObjs <= (int)uVar7) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    puVar2 = pGVar1->pMuxes;
    if (puVar2 == (uint *)0x0) {
      bVar11 = true;
    }
    else {
      bVar11 = puVar2[uVar7] == 0;
    }
    pVVar10 = p->vCutSets;
    if ((int)uVar7 < pVVar10->nSize) {
      return -1;
    }
    if (puVar2 == (uint *)0x0 || bVar11 != false) {
      uVar8 = bVar11 - 1;
    }
    else {
      uVar8 = puVar2[uVar7];
      if (uVar8 == 0) {
        uVar8 = 0xffffffff;
      }
      else {
        if ((int)uVar8 < 0) goto LAB_00682b25;
        uVar8 = uVar8 >> 1;
      }
    }
    if ((puVar2 != (uint *)0x0 && bVar11 == false) && ((int)puVar2[uVar7] < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf3,"int Abc_LitIsCompl(int)");
    }
    iFan0 = uVar7 - ((uint)*(undefined8 *)(pGVar1->pObjs + uVar7) & 0x1fffffff);
    if (-1 < (int)iFan0) {
      iVar5 = p->vCosts->nSize;
      if (((((int)iFan0 < iVar5) &&
           (uVar7 = uVar7 - ((uint)((ulong)*(undefined8 *)(pGVar1->pObjs + uVar7) >> 0x20) &
                            0x1fffffff), -1 < (int)uVar7)) && ((int)uVar7 < iVar5)) &&
         ((-1 < (int)uVar8 && ((int)uVar8 < iVar5)))) {
        piVar3 = p->vCosts->pArray;
        iVar4 = piVar3[iFan0] >> 4;
        iVar6 = piVar3[uVar7] >> 4;
        iVar9 = piVar3[uVar8] >> 4;
        iVar5 = iVar9;
        if (iVar9 < iVar6) {
          iVar5 = iVar6;
        }
        Target = iVar5;
        if (iVar5 < iVar4) {
          Target = iVar4;
        }
        if ((0 < Target) &&
           (iVar5 = Bal_ManDeriveCuts(p,iFan0,uVar7,uVar8,(int)pVVar10,in_R9D,
                                      in_stack_ffffffffffffff98,(uint)(iVar4 < iVar5),
                                      (uint)(iVar6 != Target),(uint)(iVar9 != Target),
                                      in_stack_ffffffffffffffb8,Target,1), -1 < iVar5)) {
          return iVar5;
        }
        iVar5 = Bal_ManDeriveCuts(p,iFan0,uVar7,uVar8,(int)pVVar10,in_R9D,in_stack_ffffffffffffff98,
                                  1,1,1,in_stack_ffffffffffffffb8,Target + 1,1);
        if (-1 < iVar5) {
          return iVar5;
        }
        __assert_fail("Cost >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                      ,0x20b,"int Bal_ManSetGateLevel(Bal_Man_t *, Gia_Obj_t *, int)");
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_00682b25:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
}

Assistant:

int Bal_ManSetGateLevel( Bal_Man_t * p, Gia_Obj_t * pObjOld, int iLitNew )
{
    int iFan0, iFan1, iFan2, Cost;
    int fCompl0, fCompl1, fCompl2;
    int fUnit0, fUnit1, fUnit2;
    int Delay0, Delay1, Delay2, DelayMax;
    int iObjNew = Abc_Lit2Var(iLitNew);
    Gia_Obj_t * pObjNew = Gia_ManObj( p->pNew, iObjNew );
    int fMux = Gia_ObjIsMux(p->pNew, pObjNew);
    if ( iObjNew < Vec_PtrSize(p->vCutSets) )
        return -1;
    iFan0    = Gia_ObjFaninId0( pObjNew, iObjNew );
    iFan1    = Gia_ObjFaninId1( pObjNew, iObjNew );
    iFan2    = fMux ? Gia_ObjFaninId2(p->pNew, iObjNew) : 0;
    fCompl0  = Gia_ObjFaninC0( pObjNew );
    fCompl1  = Gia_ObjFaninC1( pObjNew );
    fCompl2  = fMux ? Gia_ObjFaninC2(p->pNew, pObjNew) : 0;
    Delay0   = Bal_ObjDelay( p, iFan0 );
    Delay1   = Bal_ObjDelay( p, iFan1 );
    Delay2   = Bal_ObjDelay( p, iFan2 );
    DelayMax = Abc_MaxInt( Delay0, Abc_MaxInt(Delay1, Delay2) );
    fUnit0   = (int)(Delay0 != DelayMax); 
    fUnit1   = (int)(Delay1 != DelayMax); 
    fUnit2   = (int)(Delay2 != DelayMax); 
    if ( DelayMax > 0 )
    {
//printf( "A" );
        Cost = Bal_ManDeriveCuts(p, iFan0, iFan1, iFan2, fCompl0, fCompl1, fCompl2, fUnit0, fUnit1, fUnit2, Gia_ObjIsXor(pObjNew), DelayMax, 1 );
//printf( "B" );
        if ( Cost >= 0 )
            return Cost;
    }
    DelayMax++;
    fUnit0 = fUnit1 = fUnit2 = 1;
//printf( "A" );
    Cost = Bal_ManDeriveCuts(p, iFan0, iFan1, iFan2, fCompl0, fCompl1, fCompl2, fUnit0, fUnit1, fUnit2, Gia_ObjIsXor(pObjNew), DelayMax, 1 );
//printf( "B" );
    assert( Cost >= 0 );
    return Cost;
}